

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O0

shared_ptr<wallet::CWallet> wallet::GetWalletForJSONRPCRequest(JSONRPCRequest *request)

{
  bool bVar1;
  undefined8 uVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  long in_FS_OFFSET;
  shared_ptr<wallet::CWallet> sVar3;
  WalletContext *context;
  shared_ptr<wallet::CWallet> *wallet;
  size_t count;
  string wallet_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffed8;
  size_t *in_stack_fffffffffffffee8;
  WalletContext *in_stack_fffffffffffffef0;
  string *in_stack_ffffffffffffff08;
  JSONRPCRequest *in_stack_ffffffffffffff10;
  element_type *context_00;
  undefined8 in_stack_ffffffffffffff28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  undefined1 in_stack_ffffffffffffff30;
  undefined1 in_stack_ffffffffffffff31;
  undefined1 in_stack_ffffffffffffff32;
  undefined1 in_stack_ffffffffffffff33;
  undefined4 in_stack_ffffffffffffff34;
  undefined2 in_stack_ffffffffffffff38;
  undefined1 in_stack_ffffffffffffff3a;
  undefined1 in_stack_ffffffffffffff3b;
  undefined4 in_stack_ffffffffffffff3c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  context_00 = in_RDI;
  inline_check_non_fatal<bool>
            ((bool *)CONCAT44(in_stack_ffffffffffffff3c,
                              CONCAT13(in_stack_ffffffffffffff3b,
                                       CONCAT12(in_stack_ffffffffffffff3a,in_stack_ffffffffffffff38)
                                      )),
             (char *)CONCAT44(in_stack_ffffffffffffff34,
                              CONCAT13(in_stack_ffffffffffffff33,
                                       CONCAT12(in_stack_ffffffffffffff32,
                                                CONCAT11(in_stack_ffffffffffffff31,
                                                         in_stack_ffffffffffffff30)))),
             (int)((ulong)in_stack_ffffffffffffff28 >> 0x20),(char *)in_RDI,(char *)in_RDI);
  EnsureWalletContext((any *)in_stack_ffffffffffffff10);
  this = &local_28;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffef0);
  bVar1 = GetWalletNameFromJSONRPCRequest(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  if (bVar1) {
    GetWallet((WalletContext *)context_00,(string *)in_RDI);
    bVar1 = std::__shared_ptr::operator_cast_to_bool
                      ((__shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2> *)
                       in_stack_fffffffffffffed8);
    if (!bVar1) {
      uVar2 = __cxa_allocate_exception(0x58);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (this,(char *)context_00,(allocator<char> *)in_RDI);
      JSONRPCError((int)((ulong)this >> 0x20),(string *)in_RDI);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        __cxa_throw(uVar2,&UniValue::typeinfo,UniValue::~UniValue);
      }
      goto LAB_005e195c;
    }
  }
  else {
    GetDefaultWallet(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    bVar1 = std::__shared_ptr::operator_cast_to_bool
                      ((__shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2> *)
                       in_stack_fffffffffffffed8);
    if (!bVar1) {
      uVar2 = __cxa_allocate_exception(0x58);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (this,(char *)context_00,(allocator<char> *)in_RDI);
      JSONRPCError((int)((ulong)this >> 0x20),(string *)in_RDI);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        __cxa_throw(uVar2,&UniValue::typeinfo,UniValue::~UniValue);
      }
      goto LAB_005e195c;
    }
  }
  std::__cxx11::string::~string(in_stack_fffffffffffffed8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    sVar3.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         extraout_RDX._M_pi;
    sVar3.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr = context_00;
    return (shared_ptr<wallet::CWallet>)
           sVar3.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>;
  }
LAB_005e195c:
  __stack_chk_fail();
}

Assistant:

std::shared_ptr<CWallet> GetWalletForJSONRPCRequest(const JSONRPCRequest& request)
{
    CHECK_NONFATAL(request.mode == JSONRPCRequest::EXECUTE);
    WalletContext& context = EnsureWalletContext(request.context);

    std::string wallet_name;
    if (GetWalletNameFromJSONRPCRequest(request, wallet_name)) {
        std::shared_ptr<CWallet> pwallet = GetWallet(context, wallet_name);
        if (!pwallet) throw JSONRPCError(RPC_WALLET_NOT_FOUND, "Requested wallet does not exist or is not loaded");
        return pwallet;
    }

    size_t count{0};
    auto wallet = GetDefaultWallet(context, count);
    if (wallet) return wallet;

    if (count == 0) {
        throw JSONRPCError(
            RPC_WALLET_NOT_FOUND, "No wallet is loaded. Load a wallet using loadwallet or create a new one with createwallet. (Note: A default wallet is no longer automatically created)");
    }
    throw JSONRPCError(RPC_WALLET_NOT_SPECIFIED,
        "Multiple wallets are loaded. Please select which wallet to use by requesting the RPC through the /wallet/<walletname> URI path.");
}